

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZPardisoSolver.cpp
# Opt level: O2

void __thiscall TPZPardisoSolver<double>::TPZPardisoSolver(TPZPardisoSolver<double> *this)

{
  TPZManVector<long_long,_64> *this_00;
  longlong local_38;
  
  TPZMatrixSolver<double>::TPZMatrixSolver(&this->super_TPZMatrixSolver<double>,&PTR_PTR_016575a8);
  (this->super_TPZMatrixSolver<double>).super_TPZSolver.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZPardisoSolver_01657518;
  this->fSystemType = ENonInitialized;
  this->fStructure = ENonInitialized;
  this->fProperty = ENonInitialized;
  TPZAutoPointer<TPZManVector<long_long,_64>_>::TPZAutoPointer(&this->fPardisoControl);
  this->fHandle = (longlong *)0x0;
  local_38 = 0;
  TPZManVector<long_long,_64>::TPZManVector(&this->fParam,0x40,&local_38);
  this->fMax_num_factors = 1;
  this->fMatrix_num = 1;
  this->fMessageLevel = 0;
  this->fError = 0;
  (this->fPermutation)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01658448;
  (this->fPermutation).fStore = (longlong *)0x0;
  (this->fPermutation).fNElements = 0;
  (this->fPermutation).fNAlloc = 0;
  this->fMatrixType = 0;
  this->fDecomposed = false;
  this->fPardisoInitialized = false;
  this_00 = (TPZManVector<long_long,_64> *)operator_new(0x220);
  local_38 = 0;
  TPZManVector<long_long,_64>::TPZManVector(this_00,0x40,&local_38);
  TPZAutoPointer<TPZManVector<long_long,_64>_>::operator=(&this->fPardisoControl,this_00);
  this->fHandle = (((this->fPardisoControl).fRef)->fPointer->super_TPZVec<long_long>).fStore;
  return;
}

Assistant:

TPZPardisoSolver<TVar>::TPZPardisoSolver() :
    TPZMatrixSolver<TVar>(),fPardisoControl(),fParam(64,0)
{
    fPardisoControl = new TPZManVector<long long,64>(64,0);
    fHandle = &fPardisoControl.operator->()->operator[](0);
}